

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

bool __thiscall cmGeneratedFileStreamBase::Close(cmGeneratedFileStreamBase *this)

{
  bool bVar1;
  int iVar2;
  cmGeneratedFileStreamBase *this_00;
  string resname;
  string gzname;
  string local_b0;
  undefined1 local_90 [40];
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40 [3];
  
  std::__cxx11::string::string((string *)&local_b0,(string *)this);
  if ((this->Compress == true) && (this->CompressExtraExtension == true)) {
    std::__cxx11::string::append((char *)&local_b0);
  }
  if (((this->Name)._M_string_length == 0) || (this->Okay != true)) {
LAB_00165d4c:
    bVar1 = false;
  }
  else {
    if (this->CopyIfDifferent == true) {
      bVar1 = cmsys::SystemTools::FilesDiffer(&this->TempName,&local_b0);
      if (!bVar1) goto LAB_00165d4c;
    }
    if (this->Compress == true) {
      local_40[0]._8_8_ = (this->TempName)._M_dataplus._M_p;
      local_40[0]._0_8_ = (this->TempName)._M_string_length;
      local_90._32_8_ = (pointer)0x8;
      local_68 = ".temp.gz";
      this_00 = (cmGeneratedFileStreamBase *)local_90;
      cmStrCat<>((string *)this_00,(cmAlphaNum *)local_40,(cmAlphaNum *)(local_90 + 0x20));
      iVar2 = CompressFile(this_00,&this->TempName,(string *)local_90);
      if (iVar2 != 0) {
        cmSystemTools::RenameFile((string *)local_90,&local_b0);
      }
      cmsys::SystemTools::RemoveFile((string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      bVar1 = true;
    }
    else {
      bVar1 = true;
      cmSystemTools::RenameFile(&this->TempName,&local_b0);
    }
  }
  if ((this->TempName)._M_string_length != 0) {
    cmsys::SystemTools::RemoveFile(&this->TempName);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return bVar1;
}

Assistant:

bool cmGeneratedFileStreamBase::Close()
{
  bool replaced = false;

  std::string resname = this->Name;
  if (this->Compress && this->CompressExtraExtension) {
    resname += ".gz";
  }

  // Only consider replacing the destination file if no error
  // occurred.
  if (!this->Name.empty() && this->Okay &&
      (!this->CopyIfDifferent ||
       cmSystemTools::FilesDiffer(this->TempName, resname))) {
    // The destination is to be replaced.  Rename the temporary to the
    // destination atomically.
    if (this->Compress) {
      std::string gzname = cmStrCat(this->TempName, ".temp.gz");
      if (this->CompressFile(this->TempName, gzname)) {
        this->RenameFile(gzname, resname);
      }
      cmSystemTools::RemoveFile(gzname);
    } else {
      this->RenameFile(this->TempName, resname);
    }

    replaced = true;
  }

  // Else, the destination was not replaced.
  //
  // Always delete the temporary file. We never want it to stay around.
  if (!this->TempName.empty()) {
    cmSystemTools::RemoveFile(this->TempName);
  }

  return replaced;
}